

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxequilisc.hpp
# Opt level: O2

void __thiscall
soplex::SPxEquiliSC<double>::scale(SPxEquiliSC<double> *this,SPxLPBase<double> *lp,bool persistent)

{
  SPxOut *pSVar1;
  DataArray<int> **ppDVar2;
  DataArray<int> **ppDVar3;
  char *t;
  SPxLPBase<double> *vecset;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  Real epsilon;
  double t_00;
  double t_01;
  double t_02;
  double t_03;
  double t_04;
  double t_05;
  double t_06;
  double t_07;
  double t_08;
  double t_09;
  Verbosity old_verbosity;
  undefined4 uStack_4c;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  double local_40;
  double local_38;
  
  pSVar1 = (this->super_SPxScaler<double>).spxout;
  if ((pSVar1 != (SPxOut *)0x0) && (2 < (int)pSVar1->m_verbosity)) {
    old_verbosity = pSVar1->m_verbosity;
    (*pSVar1->_vptr_SPxOut[2])();
    pSVar1 = soplex::operator<<((this->super_SPxScaler<double>).spxout,"Equilibrium scaling LP");
    t = "";
    if (persistent) {
      t = " (persistent)";
    }
    pSVar1 = soplex::operator<<(pSVar1,t);
    std::endl<char,std::char_traits<char>>(pSVar1->m_streams[pSVar1->m_verbosity]);
    pSVar1 = (this->super_SPxScaler<double>).spxout;
    (*pSVar1->_vptr_SPxOut[2])(pSVar1,&old_verbosity);
  }
  (**(this->super_SPxScaler<double>)._vptr_SPxScaler)(this,lp);
  (*(this->super_SPxScaler<double>)._vptr_SPxScaler[0x33])(this,lp);
  local_38 = extraout_XMM0_Qa;
  (*(this->super_SPxScaler<double>)._vptr_SPxScaler[0x34])(this,lp);
  local_40 = extraout_XMM0_Qa_00;
  std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)&old_verbosity,
             &(this->super_SPxScaler<double>)._tolerances.
              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
  epsilon = Tolerances::epsilon((Tolerances *)CONCAT44(uStack_4c,old_verbosity));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48);
  pSVar1 = (this->super_SPxScaler<double>).spxout;
  if ((pSVar1 != (SPxOut *)0x0) && (3 < (int)pSVar1->m_verbosity)) {
    old_verbosity = pSVar1->m_verbosity;
    (*pSVar1->_vptr_SPxOut[2])();
    pSVar1 = soplex::operator<<((this->super_SPxScaler<double>).spxout,"before scaling:");
    pSVar1 = soplex::operator<<(pSVar1," min= ");
    (*(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[3])(lp,1);
    pSVar1 = soplex::operator<<(pSVar1,t_00);
    pSVar1 = soplex::operator<<(pSVar1," max= ");
    (*(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[4])(lp,1);
    pSVar1 = soplex::operator<<(pSVar1,t_01);
    pSVar1 = soplex::operator<<(pSVar1," col-ratio= ");
    pSVar1 = soplex::operator<<(pSVar1,local_38);
    pSVar1 = soplex::operator<<(pSVar1," row-ratio= ");
    pSVar1 = soplex::operator<<(pSVar1,local_40);
    std::endl<char,std::char_traits<char>>(pSVar1->m_streams[pSVar1->m_verbosity]);
    pSVar1 = (this->super_SPxScaler<double>).spxout;
    (*pSVar1->_vptr_SPxOut[2])(pSVar1,&old_verbosity);
  }
  if (local_40 <= local_38) {
    computeEquiExpVec((SVSetBase<double> *)lp,(this->super_SPxScaler<double>).m_activeColscaleExp,
                      (this->super_SPxScaler<double>).m_activeRowscaleExp,epsilon);
    if ((this->super_SPxScaler<double>).m_doBoth != true) goto LAB_001f74c9;
    ppDVar2 = &(this->super_SPxScaler<double>).m_activeColscaleExp;
    ppDVar3 = &(this->super_SPxScaler<double>).m_activeRowscaleExp;
    vecset = (SPxLPBase<double> *)&lp->super_LPColSetBase<double>;
  }
  else {
    computeEquiExpVec(&(lp->super_LPColSetBase<double>).super_SVSetBase<double>,
                      (this->super_SPxScaler<double>).m_activeRowscaleExp,
                      (this->super_SPxScaler<double>).m_activeColscaleExp,epsilon);
    if ((this->super_SPxScaler<double>).m_doBoth == false) goto LAB_001f74c9;
    ppDVar2 = &(this->super_SPxScaler<double>).m_activeRowscaleExp;
    ppDVar3 = &(this->super_SPxScaler<double>).m_activeColscaleExp;
    vecset = lp;
  }
  computeEquiExpVec((SVSetBase<double> *)vecset,*ppDVar3,*ppDVar2,epsilon);
LAB_001f74c9:
  (*(this->super_SPxScaler<double>)._vptr_SPxScaler[2])(this,lp);
  pSVar1 = (this->super_SPxScaler<double>).spxout;
  if (pSVar1 != (SPxOut *)0x0) {
    old_verbosity = pSVar1->m_verbosity;
    if (4 < (int)old_verbosity) {
      (*pSVar1->_vptr_SPxOut[2])();
      pSVar1 = soplex::operator<<((this->super_SPxScaler<double>).spxout,"Row scaling min= ");
      (*(this->super_SPxScaler<double>)._vptr_SPxScaler[0x31])(this);
      pSVar1 = soplex::operator<<(pSVar1,t_02);
      pSVar1 = soplex::operator<<(pSVar1," max= ");
      (*(this->super_SPxScaler<double>)._vptr_SPxScaler[0x32])(this);
      pSVar1 = soplex::operator<<(pSVar1,t_03);
      std::endl<char,std::char_traits<char>>(pSVar1->m_streams[pSVar1->m_verbosity]);
      pSVar1 = soplex::operator<<(pSVar1,"Col scaling min= ");
      (*(this->super_SPxScaler<double>)._vptr_SPxScaler[0x2f])(this);
      pSVar1 = soplex::operator<<(pSVar1,t_04);
      pSVar1 = soplex::operator<<(pSVar1," max= ");
      (*(this->super_SPxScaler<double>)._vptr_SPxScaler[0x30])(this);
      pSVar1 = soplex::operator<<(pSVar1,t_05);
      std::endl<char,std::char_traits<char>>(pSVar1->m_streams[pSVar1->m_verbosity]);
      pSVar1 = (this->super_SPxScaler<double>).spxout;
      (*pSVar1->_vptr_SPxOut[2])(pSVar1,&old_verbosity);
      pSVar1 = (this->super_SPxScaler<double>).spxout;
      if (pSVar1 == (SPxOut *)0x0) {
        return;
      }
    }
    old_verbosity = pSVar1->m_verbosity;
    if (3 < (int)old_verbosity) {
      (*pSVar1->_vptr_SPxOut[2])();
      pSVar1 = soplex::operator<<((this->super_SPxScaler<double>).spxout,"after scaling: ");
      pSVar1 = soplex::operator<<(pSVar1," min= ");
      (*(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.
        super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[3])(lp,0);
      pSVar1 = soplex::operator<<(pSVar1,t_06);
      pSVar1 = soplex::operator<<(pSVar1," max= ");
      (*(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.
        super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[4])(lp,0);
      pSVar1 = soplex::operator<<(pSVar1,t_07);
      pSVar1 = soplex::operator<<(pSVar1," col-ratio= ");
      (*(this->super_SPxScaler<double>)._vptr_SPxScaler[0x33])(this,lp);
      pSVar1 = soplex::operator<<(pSVar1,t_08);
      pSVar1 = soplex::operator<<(pSVar1," row-ratio= ");
      (*(this->super_SPxScaler<double>)._vptr_SPxScaler[0x34])(this,lp);
      pSVar1 = soplex::operator<<(pSVar1,t_09);
      std::endl<char,std::char_traits<char>>(pSVar1->m_streams[pSVar1->m_verbosity]);
      pSVar1 = (this->super_SPxScaler<double>).spxout;
      (*pSVar1->_vptr_SPxOut[2])(pSVar1,&old_verbosity);
    }
  }
  return;
}

Assistant:

void SPxEquiliSC<R>::scale(SPxLPBase<R>& lp, bool persistent)
{

   SPX_MSG_INFO1((*this->spxout), (*this->spxout) << "Equilibrium scaling LP" <<
                 (persistent ? " (persistent)" : "") << std::endl;)

   this->setup(lp);

   /* We want to do the direction first, which has a lower maximal ratio,
    * since the lowest value in the scaled matrix is bounded from below by
    * the inverse of the maximum ratio of the direction that is done first
    * Example:
    *
    *                     Rowratio
    *            0.1  1   10
    *            10   1   10
    *
    * Colratio   100  1
    *
    * Row first =>         Col next =>
    *            0.1  1          0.1  1
    *            1    0.1        1    0.1
    *
    * Col first =>         Row next =>
    *            0.01 1          0.01 1
    *            1    1          1    1
    *
    */
   R colratio = this->maxColRatio(lp);
   R rowratio = this->maxRowRatio(lp);
   R epsilon = this->tolerances()->epsilon();

   bool colFirst = colratio < rowratio;

   SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "before scaling:"
                 << " min= " << lp.minAbsNzo()
                 << " max= " << lp.maxAbsNzo()
                 << " col-ratio= " << colratio
                 << " row-ratio= " << rowratio
                 << std::endl;)

   if(colFirst)
   {
      computeEquiExpVec(lp.colSet(), *this->m_activeRowscaleExp, *this->m_activeColscaleExp, epsilon);

      if(this->m_doBoth)
         computeEquiExpVec(lp.rowSet(), *this->m_activeColscaleExp, *this->m_activeRowscaleExp, epsilon);
   }
   else
   {
      computeEquiExpVec(lp.rowSet(), *this->m_activeColscaleExp, *this->m_activeRowscaleExp, epsilon);

      if(this->m_doBoth)
         computeEquiExpVec(lp.colSet(), *this->m_activeRowscaleExp, *this->m_activeColscaleExp, epsilon);
   }

   /* scale */
   this->applyScaling(lp);

   SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "Row scaling min= " << this->minAbsRowscale()
                 << " max= " << this->maxAbsRowscale()
                 << std::endl
                 << "Col scaling min= " << this->minAbsColscale()
                 << " max= " << this->maxAbsColscale()
                 << std::endl;)

   SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "after scaling: "
                 << " min= " << lp.minAbsNzo(false)
                 << " max= " << lp.maxAbsNzo(false)
                 << " col-ratio= " << this->maxColRatio(lp)
                 << " row-ratio= " << this->maxRowRatio(lp)
                 << std::endl;)

}